

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regr_sxx_syy.cpp
# Opt level: O1

AggregateFunction * duckdb::RegrSXXFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_R8;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffe0,DOUBLE);
  LogicalType::LogicalType(&local_38,DOUBLE);
  LogicalType::LogicalType(&local_50,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::RegrSState,double,double,double,duckdb::RegrSXXOperation,(duckdb::AggregateDestructorType)0>
            (in_RDI,(AggregateFunction *)&stack0xffffffffffffffe0,&local_38,&local_50,in_R8);
  LogicalType::~LogicalType(&local_50);
  LogicalType::~LogicalType(&local_38);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffe0);
  return in_RDI;
}

Assistant:

AggregateFunction RegrSXXFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<RegrSState, double, double, double, RegrSXXOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}